

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O2

int unix_write(int fd,uchar *buf,size_t size)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    while( true ) {
      sVar2 = write(fd,buf + uVar5,size - uVar5);
      iVar1 = (int)sVar2;
      if (iVar1 == 0) {
        return 0;
      }
      if (-1 < iVar1) break;
      piVar3 = __errno_location();
      if ((*piVar3 != 4) && (*piVar3 != 0xb)) {
        perror("write");
        return -1;
      }
    }
    uVar4 = (int)uVar5 + iVar1;
    uVar5 = (ulong)uVar4;
    if (uVar5 == size) {
      return uVar4;
    }
  } while( true );
}

Assistant:

int unix_write(int fd, unsigned char *buf, size_t size) {
  int i, len = 0;

  while ((i = write(fd, buf + len, size - len))) {
    if (i < 0) {
      if ((errno == EINTR) || (errno == EAGAIN))
        continue;
      else {
        perror("write");
        return -1;
      }
    } else {
      len += i;
      if (len == size)
        break;
    }
  }

  if (i == 0)
    return 0;
  else
    return len;
}